

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_setup_build_prediction_by_above_pred
               (MACROBLOCKD *xd,int rel_mi_col,uint8_t above_mi_width,MB_MODE_INFO *above_mbmi,
               build_prediction_ctxt *ctxt,int num_planes)

{
  BLOCK_SIZE BVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint8_t **ppuVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  uint8_t *puVar10;
  AV1_COMMON *pAVar11;
  ulong uVar12;
  int mi_col;
  RefCntBuffer *pRVar13;
  int x;
  uint uVar14;
  long lVar15;
  int iVar16;
  int *piVar17;
  ulong uVar18;
  scale_factors *sf;
  
  BVar1 = above_mbmi->bsize;
  mi_col = xd->mi_col + rel_mi_col;
  above_mbmi->ref_frame[1] = -1;
  (above_mbmi->interinter_comp).type = '\0';
  if (0 < num_planes) {
    uVar12 = 3;
    if (BLOCK_8X8 < BVar1) {
      uVar12 = (ulong)BVar1;
    }
    ppuVar6 = ctxt->tmp_buf;
    piVar7 = ctxt->tmp_width;
    piVar8 = ctxt->tmp_height;
    piVar9 = ctxt->tmp_stride;
    piVar17 = &xd->plane[0].dst.stride;
    uVar18 = 0;
    do {
      puVar10 = ppuVar6[uVar18];
      uVar14 = (uint)((0x10003UL >> (uVar12 & 0x3f) & 1) != 0);
      if (piVar17[-9] == 0) {
        uVar14 = 0;
      }
      iVar16 = piVar7[uVar18];
      iVar4 = piVar8[uVar18];
      iVar5 = piVar9[uVar18];
      ((buf_2d *)(piVar17 + -6))->buf =
           puVar10 + ((int)((~uVar14 & rel_mi_col) << 2) >> ((byte)piVar17[-9] & 0x1f));
      *(uint8_t **)(piVar17 + -4) = puVar10;
      piVar17[-2] = iVar16;
      piVar17[-1] = iVar4;
      *piVar17 = iVar5;
      uVar18 = uVar18 + 1;
      piVar17 = piVar17 + 0x28c;
    } while ((uint)num_planes != uVar18);
  }
  cVar2 = above_mbmi->ref_frame[1];
  lVar15 = 0;
  do {
    bVar3 = above_mbmi->ref_frame[lVar15];
    pAVar11 = ctxt->cm;
    iVar16 = -1;
    if ((byte)(bVar3 - 1) < 8) {
      iVar16 = pAVar11->remapped_ref_idx[bVar3 - 1];
    }
    if (iVar16 == -1) {
      pRVar13 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar13 = pAVar11->ref_frame_map[iVar16];
    }
    iVar16 = -1;
    if ((byte)(bVar3 - 1) < 8) {
      iVar16 = pAVar11->remapped_ref_idx[bVar3 - 1];
    }
    sf = (scale_factors *)0x0;
    if (iVar16 != -1) {
      sf = pAVar11->ref_scale_factors + iVar16;
    }
    xd->block_ref_scale_factors[lVar15] = sf;
    if ((sf->x_scale_fp == -1) || (sf->y_scale_fp == -1)) {
      aom_internal_error(xd->error_info,AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    }
    av1_setup_pre_planes(xd,(int)lVar15,&pRVar13->buf,xd->mi_row,mi_col,sf,num_planes);
  } while ((lVar15 == 0) && (lVar15 = 1, '\0' < cVar2));
  xd->mb_to_left_edge = mi_col * -0x20;
  xd->mb_to_right_edge =
       ((uint)xd->width - ((uint)above_mi_width + rel_mi_col)) * 0x20 + ctxt->mb_to_far_edge;
  return;
}

Assistant:

void av1_setup_build_prediction_by_above_pred(
    MACROBLOCKD *xd, int rel_mi_col, uint8_t above_mi_width,
    MB_MODE_INFO *above_mbmi, struct build_prediction_ctxt *ctxt,
    const int num_planes) {
  const BLOCK_SIZE a_bsize = AOMMAX(BLOCK_8X8, above_mbmi->bsize);
  const int above_mi_col = xd->mi_col + rel_mi_col;

  modify_neighbor_predictor_for_obmc(above_mbmi);

  for (int j = 0; j < num_planes; ++j) {
    struct macroblockd_plane *const pd = &xd->plane[j];
    setup_pred_plane(&pd->dst, a_bsize, ctxt->tmp_buf[j], ctxt->tmp_width[j],
                     ctxt->tmp_height[j], ctxt->tmp_stride[j], 0, rel_mi_col,
                     NULL, pd->subsampling_x, pd->subsampling_y);
  }

  const int num_refs = 1 + has_second_ref(above_mbmi);

  for (int ref = 0; ref < num_refs; ++ref) {
    const MV_REFERENCE_FRAME frame = above_mbmi->ref_frame[ref];

    const RefCntBuffer *const ref_buf = get_ref_frame_buf(ctxt->cm, frame);
    const struct scale_factors *const sf =
        get_ref_scale_factors_const(ctxt->cm, frame);
    xd->block_ref_scale_factors[ref] = sf;
    if ((!av1_is_valid_scale(sf)))
      aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_BITSTREAM,
                         "Reference frame has invalid dimensions");
    av1_setup_pre_planes(xd, ref, &ref_buf->buf, xd->mi_row, above_mi_col, sf,
                         num_planes);
  }

  xd->mb_to_left_edge = 8 * MI_SIZE * (-above_mi_col);
  xd->mb_to_right_edge =
      ctxt->mb_to_far_edge +
      (xd->width - rel_mi_col - above_mi_width) * MI_SIZE * 8;
}